

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O3

void duckdb::Planner::VerifyPlan
               (ClientContext *context,
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *op,optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>,_true>
                   map)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  undefined1 auVar2 [8];
  bool bVar3;
  DBConfig *pDVar4;
  ClientConfig *pCVar5;
  type pLVar6;
  Allocator *allocator_p;
  pointer *__ptr;
  bound_parameter_map_t parameters;
  SerializationOptions options;
  MemoryStream stream;
  undefined1 local_158 [8];
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>,_true>
  local_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_148;
  undefined1 local_110 [8];
  reference_wrapper<duckdb::ClientContext> *local_108;
  _Map_pointer local_100;
  reference_wrapper<duckdb::ClientContext> local_f8 [2];
  _Elt_pointer local_e8;
  undefined1 local_e0;
  MemoryStream local_90;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  unsigned_long *local_48 [2];
  _Elt_pointer local_38;
  bool local_30;
  
  local_150.ptr = map.ptr;
  pDVar4 = DBConfig::GetConfig(context);
  if ((op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    pCVar5 = ClientConfig::GetConfig(context);
    if (pCVar5->verify_serializer == true) {
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(op);
      bVar3 = OperatorSupportsSerialization(pLVar6);
      if (bVar3) {
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(op);
        ColumnBindingResolver::Verify(pLVar6);
        allocator_p = Allocator::Get(context);
        MemoryStream::MemoryStream(&local_90,allocator_p,0x200);
        local_110[0] = false;
        local_110[1] = false;
        SerializationCompatibility::Default();
        if ((pDVar4->options).serialization_compatibility.manually_set == true) {
          ::std::__cxx11::string::_M_assign((string *)&local_108);
          local_e0 = (pDVar4->options).serialization_compatibility.manually_set;
          local_e8 = (_Elt_pointer)
                     (pDVar4->options).serialization_compatibility.serialization_version;
        }
        else {
          SerializationCompatibility::Latest();
          ::std::__cxx11::string::operator=((string *)&local_108,(string *)&local_148);
          local_e8 = (_Elt_pointer)
                     CONCAT44(local_148._M_rehash_policy._4_4_,
                              local_148._M_rehash_policy._M_max_load_factor);
          local_e0 = (undefined1)local_148._M_rehash_policy._M_next_resize;
          if ((__node_base *)local_148._M_buckets != &local_148._M_before_begin) {
            operator_delete(local_148._M_buckets);
          }
        }
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(op);
        local_60._0_2_ = local_110._0_2_;
        local_58._M_p = (pointer)local_48;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_108,(long)local_100 + (long)local_108);
        local_30 = (bool)local_e0;
        local_38 = local_e8;
        BinarySerializer::Serialize<duckdb::LogicalOperator>
                  (pLVar6,&local_90.super_WriteStream,(SerializationOptions *)local_60);
        if ((unsigned_long **)local_58._M_p != local_48) {
          operator_delete(local_58._M_p);
        }
        MemoryStream::Rewind(&local_90);
        local_148._M_buckets = &local_148._M_single_bucket;
        local_148._M_bucket_count = 1;
        local_148._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_148._M_element_count = 0;
        local_148._M_rehash_policy._M_max_load_factor = 1.0;
        local_148._M_rehash_policy._M_next_resize = 0;
        local_148._M_single_bucket = (__node_base_ptr)0x0;
        BinaryDeserializer::Deserialize<duckdb::LogicalOperator>
                  ((BinaryDeserializer *)local_158,&local_90.super_ReadStream,context,
                   (bound_parameter_map_t *)&local_148);
        if (map.ptr !=
            (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>
             *)0x0) {
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>,_true>
          ::CheckValid(&local_150);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign(&(local_150.ptr)->_M_h,&local_148);
        }
        auVar2 = local_158;
        local_158 = (undefined1  [8])0x0;
        _Var1._M_head_impl =
             (op->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (op->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)auVar2;
        if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
          if (local_158 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_158 + 8))();
          }
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_148);
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        MemoryStream::~MemoryStream(&local_90);
      }
    }
  }
  return;
}

Assistant:

void Planner::VerifyPlan(ClientContext &context, unique_ptr<LogicalOperator> &op,
                         optional_ptr<bound_parameter_map_t> map) {
	auto &config = DBConfig::GetConfig(context);
#ifdef DUCKDB_ALTERNATIVE_VERIFY
	{
		auto &serialize_comp = config.options.serialization_compatibility;
		auto latest_version = SerializationCompatibility::Latest();
		if (serialize_comp.manually_set &&
		    serialize_comp.serialization_version != latest_version.serialization_version) {
			// Serialization should not be skipped, this test relies on the serialization to remove certain fields for
			// compatibility with older versions. This might change behavior, not doing this might make this test fail.
		} else {
			// if alternate verification is enabled we run the original operator
			return;
		}
	}
#endif
	if (!op || !ClientConfig::GetConfig(context).verify_serializer) {
		return;
	}
	//! SELECT only for now
	if (!OperatorSupportsSerialization(*op)) {
		return;
	}
	// verify the column bindings of the plan
	ColumnBindingResolver::Verify(*op);

	// format (de)serialization of this operator
	try {
		MemoryStream stream(Allocator::Get(context));

		SerializationOptions options;
		if (config.options.serialization_compatibility.manually_set) {
			// Override the default of 'latest' if this was manually set (for testing, mostly)
			options.serialization_compatibility = config.options.serialization_compatibility;
		} else {
			options.serialization_compatibility = SerializationCompatibility::Latest();
		}

		BinarySerializer::Serialize(*op, stream, options);
		stream.Rewind();
		bound_parameter_map_t parameters;
		auto new_plan = BinaryDeserializer::Deserialize<LogicalOperator>(stream, context, parameters);

		if (map) {
			*map = std::move(parameters);
		}
		op = std::move(new_plan);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		switch (error.Type()) {
		case ExceptionType::NOT_IMPLEMENTED: // NOLINT: explicitly allowing these errors (for now)
			break;                           // pass
		default:
			throw;
		}
	}
}